

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

void sam_hdr_dump(SAM_hdr *hdr)

{
  char *pcVar1;
  uint local_3c;
  SAM_hdr_tag *pSStack_38;
  int j;
  SAM_hdr_tag *tag;
  SAM_hdr_type *pSStack_28;
  char c [2];
  SAM_hdr_type *t2;
  SAM_hdr_type *t1;
  int i;
  khint_t k;
  SAM_hdr *hdr_local;
  
  printf("===DUMP===\n");
  for (t1._4_4_ = 0; t1._4_4_ != hdr->h->n_buckets; t1._4_4_ = t1._4_4_ + 1) {
    if ((hdr->h->flags[t1._4_4_ >> 4] >> (sbyte)((t1._4_4_ & 0xf) << 1) & 3) == 0) {
      t2 = hdr->h->vals[t1._4_4_];
      tag._6_1_ = (undefined1)(hdr->h->keys[t1._4_4_] >> 8);
      tag._7_1_ = (undefined1)hdr->h->keys[t1._4_4_];
      pSStack_28 = t2;
      printf("Type %.2s, count %d\n",(long)&tag + 6,(ulong)(t2->prev->order + 1));
      do {
        printf(">>>%d ",(ulong)(uint)t2->order);
        for (pSStack_38 = t2->tag; pSStack_38 != (SAM_hdr_tag *)0x0; pSStack_38 = pSStack_38->next)
        {
          printf("\"%.2s\":\"%.*s\"\t",pSStack_38->str,(ulong)(pSStack_38->len - 3),
                 pSStack_38->str + 3);
        }
        putchar(10);
        t2 = t2->next;
      } while (t2 != pSStack_28);
    }
  }
  printf("\n@PG chains:\n");
  for (t1._0_4_ = 0; (int)(uint)t1 < hdr->npg_end; t1._0_4_ = (uint)t1 + 1) {
    printf("  %d:",(ulong)(uint)t1);
    for (local_3c = hdr->pg_end[(int)(uint)t1]; local_3c != 0xffffffff;
        local_3c = hdr->pg[(int)local_3c].prev_id) {
      pcVar1 = "->";
      if (local_3c == hdr->pg_end[(int)(uint)t1]) {
        pcVar1 = " ";
      }
      printf("%s%d(%.*s)",pcVar1,(ulong)local_3c,(ulong)(uint)hdr->pg[(int)local_3c].name_len,
             hdr->pg[(int)local_3c].name);
    }
    printf("\n");
  }
  puts("===END DUMP===");
  return;
}

Assistant:

void sam_hdr_dump(SAM_hdr *hdr) {
    khint_t k;
    int i;

    printf("===DUMP===\n");
    for (k = kh_begin(hdr->h); k != kh_end(hdr->h); k++) {
	SAM_hdr_type *t1, *t2;
	char c[2];

	if (!kh_exist(hdr->h, k))
	    continue;

	t1 = t2 = kh_val(hdr->h, k);
	c[0] = kh_key(hdr->h, k)>>8;
	c[1] = kh_key(hdr->h, k)&0xff;
	printf("Type %.2s, count %d\n", c, t1->prev->order+1);

	do {
	    SAM_hdr_tag *tag;
	    printf(">>>%d ", t1->order);
	    for (tag = t1->tag; tag; tag=tag->next) {
		printf("\"%.2s\":\"%.*s\"\t",
		       tag->str, tag->len-3, tag->str+3);
	    }
	    putchar('\n');
	    t1 = t1->next;
	} while (t1 != t2);
    }

    /* Dump out PG chains */
    printf("\n@PG chains:\n");
    for (i = 0; i < hdr->npg_end; i++) {
	int j;
	printf("  %d:", i);
	for (j = hdr->pg_end[i]; j != -1; j = hdr->pg[j].prev_id) {
	    printf("%s%d(%.*s)", 
		   j == hdr->pg_end[i] ? " " : "->",
		   j, hdr->pg[j].name_len, hdr->pg[j].name);
	}
	printf("\n");
    }

    puts("===END DUMP===");
}